

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

void __thiscall ncnn::ParamDict::ParamDict(ParamDict *this)

{
  long in_RDI;
  ParamDict *in_stack_00000010;
  undefined8 local_20;
  
  local_20 = in_RDI;
  do {
    {unnamed_type#1}::ParamDict((anon_struct_72_3_b6d6cd30 *)0x11ed26);
    local_20 = local_20 + 0x48;
  } while (local_20 != in_RDI + 0x900);
  clear(in_stack_00000010);
  return;
}

Assistant:

ParamDict::ParamDict()
{
    clear();
}